

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

void bson_meta(lua_State *L)

{
  int iVar1;
  luaL_Reg l [3];
  
  iVar1 = luaL_newmetatable(L,"bson");
  if (iVar1 != 0) {
    l[2].name = (char *)0x0;
    l[2].func = (lua_CFunction)0x0;
    l[1].name = "makeindex";
    l[1].func = lmakeindex;
    l[0].name = "decode";
    l[0].func = ldecode;
    luaL_checkversion_(L,503.0,0x88);
    lua_createtable(L,0,2);
    luaL_setfuncs(L,l,0);
    lua_setfield(L,-2,"__index");
    lua_pushcclosure(L,ltostring,0);
    lua_setfield(L,-2,"__tostring");
    lua_pushcclosure(L,llen,0);
    lua_setfield(L,-2,"__len");
    lua_pushcclosure(L,lreplace,0);
    lua_setfield(L,-2,"__newindex");
  }
  lua_setmetatable(L,-2);
  return;
}

Assistant:

static void
bson_meta(lua_State *L) {
	if (luaL_newmetatable(L, "bson")) {
		luaL_Reg l[] = {
			{ "decode", ldecode },
			{ "makeindex", lmakeindex },
			{ NULL, NULL },
		};
		luaL_newlib(L,l);
		lua_setfield(L, -2, "__index");
		lua_pushcfunction(L, ltostring);
		lua_setfield(L, -2, "__tostring");
		lua_pushcfunction(L, llen);
		lua_setfield(L, -2, "__len");
		lua_pushcfunction(L, lreplace);
		lua_setfield(L, -2, "__newindex");
	}
	lua_setmetatable(L, -2);
}